

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cc
# Opt level: O0

void list_push_front(list *list,list_elem *e)

{
  list_elem *e_local;
  list *list_local;
  
  if (list->head == (list_elem *)0x0) {
    list->head = e;
    list->tail = e;
    e->prev = (list_elem *)0x0;
    e->next = (list_elem *)0x0;
  }
  else {
    list->head->prev = e;
    e->prev = (list_elem *)0x0;
    e->next = list->head;
    list->head = e;
  }
  return;
}

Assistant:

void list_push_front(struct list *list, struct list_elem *e)
{
    IFDEF_LOCK( spin_lock(&list->lock); );
    if (list->head == NULL) {
        list->head = e;
        list->tail = e;
        e->next = e->prev = NULL;
    }else{
        list->head->prev = e;
        e->prev = NULL;
        e->next = list->head;
        list->head = e;
    }
    IFDEF_LOCK( spin_unlock(&list->lock); );
}